

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkOrderCisCos(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  long lVar4;
  
  pNtk->vCis->nSize = 0;
  pNtk->vCos->nSize = 0;
  for (iVar3 = 0; iVar3 < pNtk->vPis->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,iVar3);
    Vec_PtrPush(pNtk->vCis,pAVar2);
  }
  for (iVar3 = 0; iVar3 < pNtk->vPos->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,iVar3);
    Vec_PtrPush(pNtk->vCos,pAVar2);
  }
  for (iVar3 = 0; iVar1 = pNtk->vBoxes->nSize, iVar3 < iVar1; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkBox(pNtk,iVar3);
    if ((*(uint *)&pAVar2->field_0x14 & 0xf) != 8) {
      for (lVar4 = 0; lVar4 < (pAVar2->vFanins).nSize; lVar4 = lVar4 + 1) {
        Vec_PtrPush(pNtk->vCos,pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar4]]);
      }
      for (lVar4 = 0; lVar4 < (pAVar2->vFanouts).nSize; lVar4 = lVar4 + 1) {
        Vec_PtrPush(pNtk->vCis,pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanouts).pArray[lVar4]]);
      }
    }
  }
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkBox(pNtk,iVar3);
    if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
      for (lVar4 = 0; lVar4 < (pAVar2->vFanins).nSize; lVar4 = lVar4 + 1) {
        Vec_PtrPush(pNtk->vCos,pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar4]]);
      }
      for (lVar4 = 0; lVar4 < (pAVar2->vFanouts).nSize; lVar4 = lVar4 + 1) {
        Vec_PtrPush(pNtk->vCis,pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanouts).pArray[lVar4]]);
      }
    }
    iVar1 = pNtk->vBoxes->nSize;
  }
  return;
}

Assistant:

void Abc_NtkOrderCisCos( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pTerm;
    int i, k;
    Vec_PtrClear( pNtk->vCis );
    Vec_PtrClear( pNtk->vCos );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Vec_PtrPush( pNtk->vCis, pObj );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Vec_PtrPush( pNtk->vCos, pObj );
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCos, pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCis, pTerm );
    }
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsLatch(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCos, pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCis, pTerm );
    }
}